

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_pack1to4.h
# Opt level: O0

void ncnn::deconvolution_pack1to4_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_packed,Mat *bias_data,int kernel_w,
               int kernel_h,int dilation_w,int dilation_h,int stride_w,int stride_h,
               int activation_type,Mat *activation_params,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  long lVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  int iVar68;
  int iVar69;
  undefined8 *puVar70;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar75 [16];
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  undefined4 in_stack_00000028;
  long *in_stack_00000030;
  __m128 _w;
  __m128 _val;
  int k;
  float val;
  int sx;
  int sxs;
  int x;
  float *sptr;
  int sy;
  int sys;
  int y;
  Mat m_2;
  int q;
  float *kptr;
  __m128 _sum;
  int j;
  int i;
  int outh;
  int outw;
  int channels;
  int h;
  int w;
  int maxk;
  float *outptr;
  int p;
  float *bias_data_ptr;
  int kernel_extent_h;
  int kernel_extent_w;
  int outch;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  __m128 _b;
  __m128 _a;
  __m128 max;
  __m128 min;
  __m128 neg;
  __m128 pos;
  __m128 one;
  __m128 one_7;
  v4sf pow2n_1;
  v4sf y_2;
  v4sf mask_1;
  v4sf one_2;
  v4si emm0_1;
  v4sf fx_1;
  v4sf tmp_1;
  v4sf pow2n;
  v4sf y_1;
  v4sf mask;
  v4sf one_1;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  __m128 two;
  __m128 one_4;
  __m128 one_5;
  v4sf pow2n_2;
  v4sf y_4;
  v4sf mask_3;
  v4sf one_6;
  v4si emm0_3;
  v4sf fx_2;
  v4sf tmp_3;
  v4sf y_3;
  v4sf z;
  v4sf tmp_2;
  v4sf mask_2;
  v4sf e;
  v4sf invalid_mask;
  v4sf one_3;
  v4si emm0_2;
  int local_2244;
  int local_222c;
  int local_21dc;
  long local_2190;
  undefined8 local_2188;
  undefined8 uStack_2180;
  int local_2174;
  int local_2170;
  undefined8 *local_2100;
  int local_20f4;
  float local_1de8;
  float fStack_1de4;
  float fStack_1de0;
  float fStack_1ddc;
  undefined1 local_1d68 [8];
  undefined8 uStack_1d60;
  ulong uStack_1d50;
  float local_1cf8;
  float fStack_1cf4;
  float fStack_1cf0;
  float fStack_1cec;
  float local_1c28;
  float fStack_1c24;
  float fStack_1c20;
  float fStack_1c1c;
  float local_1c18;
  float fStack_1c14;
  float fStack_1c10;
  float fStack_1c0c;
  ulong uStack_1ab0;
  float local_1a38;
  float fStack_1a34;
  float fStack_1a30;
  float fStack_1a2c;
  float fStack_1a20;
  float fStack_1a1c;
  undefined8 local_19e8;
  undefined8 uStack_19e0;
  float local_1988;
  float fStack_1984;
  float local_1978;
  float fStack_1974;
  float fStack_1970;
  float fStack_196c;
  undefined8 local_1888;
  undefined8 uStack_1880;
  undefined8 local_1878;
  undefined8 uStack_1870;
  float local_1578;
  float fStack_1574;
  float fStack_1570;
  float fStack_156c;
  float local_1548;
  float fStack_1544;
  float fStack_1540;
  float fStack_153c;
  float local_1528;
  float fStack_1524;
  float fStack_1520;
  float fStack_151c;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined8 local_1488;
  undefined8 uStack_1480;
  float local_1188;
  float fStack_1184;
  float fStack_1180;
  float fStack_117c;
  float local_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float local_f18;
  float fStack_f14;
  float fStack_f10;
  float fStack_f0c;
  float local_e58;
  float fStack_e54;
  float fStack_e50;
  float fStack_e4c;
  float local_dc8;
  float fStack_dc4;
  float fStack_dc0;
  float fStack_dbc;
  float local_da8;
  float fStack_da4;
  float fStack_da0;
  float fStack_d9c;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  float local_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  undefined1 local_738 [8];
  float fStack_730;
  float fStack_72c;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  float local_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float local_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float local_668;
  float fStack_664;
  float fStack_660;
  float fStack_65c;
  float local_648;
  float fStack_644;
  float fStack_640;
  float fStack_63c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  
  lVar64 = in_RSI[7];
  lVar4 = *in_RCX;
  for (local_20f4 = 0; local_20f4 < (int)lVar64; local_20f4 = local_20f4 + 1) {
    local_2100 = (undefined8 *)(*in_RSI + in_RSI[8] * (long)local_20f4 * in_RSI[2]);
    iVar2 = *(int *)((long)in_RDI + 0x2c);
    lVar65 = in_RDI[6];
    lVar66 = in_RDI[7];
    iVar3 = *(int *)((long)in_RSI + 0x2c);
    lVar67 = in_RSI[6];
    for (local_2170 = 0; local_2170 < (int)lVar67; local_2170 = local_2170 + 1) {
      for (local_2174 = 0; local_2174 < iVar3; local_2174 = local_2174 + 1) {
        local_2188 = 0;
        uStack_2180 = 0;
        if (lVar4 != 0) {
          puVar70 = (undefined8 *)(lVar4 + (long)(local_20f4 << 2) * 4);
          local_2188 = *puVar70;
          uStack_2180 = puVar70[1];
        }
        local_2190 = *in_RDX + in_RDX[8] * (long)local_20f4 * in_RDX[2];
        for (local_21dc = 0; local_21dc < (int)lVar66; local_21dc = local_21dc + 1) {
          for (local_222c = 0; local_222c < in_R9D; local_222c = local_222c + 1) {
            iVar68 = (local_2170 + local_222c * in_stack_00000010) -
                     in_stack_00000010 * (in_R9D + -1);
            if (((-1 < iVar68) && (iVar68 % in_stack_00000020 == 0)) &&
               (iVar68 / in_stack_00000020 < (int)lVar65)) {
              for (local_2244 = 0; local_2244 < in_R8D; local_2244 = local_2244 + 1) {
                iVar69 = (local_2174 + local_2244 * in_stack_00000008) -
                         in_stack_00000008 * (in_R8D + -1);
                if (((-1 < iVar69) && (iVar69 % in_stack_00000018 == 0)) &&
                   (iVar69 / in_stack_00000018 < iVar2)) {
                  fVar71 = *(float *)(*in_RDI + in_RDI[8] * (long)local_21dc * in_RDI[2] +
                                      (long)*(int *)((long)in_RDI + 0x2c) *
                                      (long)(iVar68 / in_stack_00000020) * in_RDI[2] +
                                     (long)(iVar69 / in_stack_00000018) * 4);
                  puVar70 = (undefined8 *)
                            (local_2190 + (long)((local_222c * in_R8D + local_2244) * 4) * 4);
                  uVar9 = *puVar70;
                  uVar10 = puVar70[1];
                  local_1cf8 = (float)uVar9;
                  fStack_1cf4 = (float)((ulong)uVar9 >> 0x20);
                  fStack_1cf0 = (float)uVar10;
                  fStack_1cec = (float)((ulong)uVar10 >> 0x20);
                  local_1de8 = (float)local_2188;
                  fStack_1de4 = (float)((ulong)local_2188 >> 0x20);
                  fStack_1de0 = (float)uStack_2180;
                  fStack_1ddc = (float)((ulong)uStack_2180 >> 0x20);
                  local_2188 = CONCAT44(fVar71 * fStack_1cf4 + fStack_1de4,
                                        fVar71 * local_1cf8 + local_1de8);
                  uStack_2180 = CONCAT44(fVar71 * fStack_1cec + fStack_1ddc,
                                         fVar71 * fStack_1cf0 + fStack_1de0);
                }
              }
            }
          }
          local_2190 = local_2190 + (long)(in_R8D * in_R9D * 4) * 4;
        }
        fStack_1a20 = (float)uStack_2180;
        fStack_1a1c = (float)((ulong)uStack_2180 >> 0x20);
        local_1988 = (float)local_2188;
        fStack_1984 = (float)((ulong)local_2188 >> 0x20);
        switch(in_stack_00000028) {
        case 1:
          uStack_1d50 = SUB168(ZEXT816(0),4);
          auVar11._8_8_ = uStack_2180;
          auVar11._0_8_ = local_2188;
          auVar62._8_8_ = 0;
          auVar62._0_8_ = uStack_1d50;
          _local_1d68 = vmaxps_avx(auVar11,auVar62 << 0x40);
          break;
        case 2:
          fVar71 = *(float *)*in_stack_00000030;
          auVar14._8_8_ = uStack_2180;
          auVar14._0_8_ = local_2188;
          auVar7 = vmaxps_avx(ZEXT816(0),auVar14);
          auVar15._8_8_ = uStack_2180;
          auVar15._0_8_ = local_2188;
          auVar5 = vminps_avx(ZEXT816(0),auVar15);
          local_1c18 = auVar5._0_4_;
          fStack_1c14 = auVar5._4_4_;
          fStack_1c10 = auVar5._8_4_;
          fStack_1c0c = auVar5._12_4_;
          local_1c28 = auVar7._0_4_;
          fStack_1c24 = auVar7._4_4_;
          fStack_1c20 = auVar7._8_4_;
          fStack_1c1c = auVar7._12_4_;
          local_1d68._4_4_ = fStack_1c24 + fVar71 * fStack_1c14;
          local_1d68._0_4_ = local_1c28 + fVar71 * local_1c18;
          uStack_1d60._0_4_ = fStack_1c20 + fVar71 * fStack_1c10;
          uStack_1d60._4_4_ = fStack_1c1c + fVar71 * fStack_1c0c;
          break;
        case 3:
          uVar1 = *(undefined4 *)*in_stack_00000030;
          auVar12._4_4_ = uVar1;
          auVar12._0_4_ = uVar1;
          auVar12._12_4_ = uVar1;
          auVar12._8_4_ = uVar1;
          uVar1 = *(undefined4 *)(*in_stack_00000030 + 4);
          auVar16._4_4_ = uVar1;
          auVar16._0_4_ = uVar1;
          auVar16._12_4_ = uVar1;
          auVar16._8_4_ = uVar1;
          auVar13._8_8_ = uStack_2180;
          auVar13._0_8_ = local_2188;
          auVar7 = vmaxps_avx(auVar13,auVar12);
          _local_1d68 = vminps_avx(auVar7,auVar16);
          break;
        case 4:
          auVar17._8_8_ = 0x3f8000003f800000;
          auVar17._0_8_ = 0x3f8000003f800000;
          uStack_1ab0 = SUB168(ZEXT816(0),4);
          auVar63._8_8_ = 0;
          auVar63._0_8_ = uStack_1ab0;
          auVar26._8_8_ = uStack_2180;
          auVar26._0_8_ = local_2188;
          auVar7 = vsubps_avx(auVar63 << 0x40,auVar26);
          auVar25._8_8_ = 0x42b0c0a542b0c0a5;
          auVar25._0_8_ = 0x42b0c0a542b0c0a5;
          auVar7 = vminps_avx(auVar7,auVar25);
          auVar24._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar24._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar6 = vmaxps_avx(auVar7,auVar24);
          local_1138 = auVar6._0_4_;
          fStack_1134 = auVar6._4_4_;
          fStack_1130 = auVar6._8_4_;
          fStack_112c = auVar6._12_4_;
          fVar71 = local_1138 * 1.442695 + 0.5;
          fVar72 = fStack_1134 * 1.442695 + 0.5;
          fVar73 = fStack_1130 * 1.442695 + 0.5;
          fVar74 = fStack_112c * 1.442695 + 0.5;
          local_1488 = CONCAT44(fVar72,fVar71);
          uStack_1480._0_4_ = fVar73;
          uStack_1480._4_4_ = fVar74;
          local_1498 = CONCAT44((int)fVar72,(int)fVar71);
          uStack_1490._0_4_ = (int)fVar73;
          uStack_1490._4_4_ = (int)fVar74;
          auVar27._8_8_ = uStack_1490;
          auVar27._0_8_ = local_1498;
          auVar5 = vcvtdq2ps_avx(auVar27);
          auVar29._8_8_ = uStack_1480;
          auVar29._0_8_ = local_1488;
          auVar7 = vcmpps_avx(auVar29,auVar5,1);
          auVar31._8_8_ = 0x3f8000003f800000;
          auVar31._0_8_ = 0x3f8000003f800000;
          auVar7 = vpand_avx(auVar7,auVar31);
          auVar7 = vsubps_avx(auVar5,auVar7);
          local_f18 = auVar7._0_4_;
          fStack_f14 = auVar7._4_4_;
          fStack_f10 = auVar7._8_4_;
          fStack_f0c = auVar7._12_4_;
          auVar34._4_4_ = fStack_f14 * 0.6933594;
          auVar34._0_4_ = local_f18 * 0.6933594;
          auVar34._8_4_ = fStack_f10 * 0.6933594;
          auVar34._12_4_ = fStack_f0c * 0.6933594;
          auVar7 = vsubps_avx(auVar6,auVar34);
          auVar33._4_4_ = fStack_f14 * -0.00021219444;
          auVar33._0_4_ = local_f18 * -0.00021219444;
          auVar33._8_4_ = fStack_f10 * -0.00021219444;
          auVar33._12_4_ = fStack_f0c * -0.00021219444;
          auVar7 = vsubps_avx(auVar7,auVar33);
          local_1158 = auVar7._0_4_;
          fStack_1154 = auVar7._4_4_;
          fStack_1150 = auVar7._8_4_;
          fStack_114c = auVar7._12_4_;
          local_1498 = CONCAT44((int)fStack_f14,(int)local_f18);
          uStack_1490._0_4_ = (int)fStack_f10;
          uStack_1490._4_4_ = (int)fStack_f0c;
          auVar23._8_8_ = uStack_1490;
          auVar23._0_8_ = local_1498;
          auVar22._8_8_ = 0x7f0000007f;
          auVar22._0_8_ = 0x7f0000007f;
          auVar7 = vpaddd_avx(auVar23,auVar22);
          auVar7 = vpslld_avx(auVar7,ZEXT416(0x17));
          local_1188 = auVar7._0_4_;
          fStack_1184 = auVar7._4_4_;
          fStack_1180 = auVar7._8_4_;
          fStack_117c = auVar7._12_4_;
          auVar18._4_4_ =
               ((((((fStack_1154 * 0.00019875691 + 0.0013981999) * fStack_1154 + 0.008333452) *
                   fStack_1154 + 0.041665796) * fStack_1154 + 0.16666666) * fStack_1154 + 0.5) *
                fStack_1154 * fStack_1154 + fStack_1154 + 1.0) * fStack_1184 + 1.0;
          auVar18._0_4_ =
               ((((((local_1158 * 0.00019875691 + 0.0013981999) * local_1158 + 0.008333452) *
                   local_1158 + 0.041665796) * local_1158 + 0.16666666) * local_1158 + 0.5) *
                local_1158 * local_1158 + local_1158 + 1.0) * local_1188 + 1.0;
          auVar18._8_4_ =
               ((((((fStack_1150 * 0.00019875691 + 0.0013981999) * fStack_1150 + 0.008333452) *
                   fStack_1150 + 0.041665796) * fStack_1150 + 0.16666666) * fStack_1150 + 0.5) *
                fStack_1150 * fStack_1150 + fStack_1150 + 1.0) * fStack_1180 + 1.0;
          auVar18._12_4_ =
               ((((((fStack_114c * 0.00019875691 + 0.0013981999) * fStack_114c + 0.008333452) *
                   fStack_114c + 0.041665796) * fStack_114c + 0.16666666) * fStack_114c + 0.5) *
                fStack_114c * fStack_114c + fStack_114c + 1.0) * fStack_117c + 1.0;
          _local_1d68 = vdivps_avx(auVar17,auVar18);
          break;
        case 5:
          auVar21._8_8_ = uStack_2180;
          auVar21._0_8_ = local_2188;
          auVar20._8_8_ = 0x42b0c0a542b0c0a5;
          auVar20._0_8_ = 0x42b0c0a542b0c0a5;
          auVar7 = vminps_avx(auVar21,auVar20);
          auVar19._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar19._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar6 = vmaxps_avx(auVar7,auVar19);
          local_1528 = auVar6._0_4_;
          fStack_1524 = auVar6._4_4_;
          fStack_1520 = auVar6._8_4_;
          fStack_151c = auVar6._12_4_;
          fVar71 = local_1528 * 1.442695 + 0.5;
          fVar72 = fStack_1524 * 1.442695 + 0.5;
          fVar73 = fStack_1520 * 1.442695 + 0.5;
          fVar74 = fStack_151c * 1.442695 + 0.5;
          local_1878 = CONCAT44(fVar72,fVar71);
          uStack_1870._0_4_ = fVar73;
          uStack_1870._4_4_ = fVar74;
          local_1888 = CONCAT44((int)fVar72,(int)fVar71);
          uStack_1880._0_4_ = (int)fVar73;
          uStack_1880._4_4_ = (int)fVar74;
          auVar28._8_8_ = uStack_1880;
          auVar28._0_8_ = local_1888;
          auVar5 = vcvtdq2ps_avx(auVar28);
          auVar30._8_8_ = uStack_1870;
          auVar30._0_8_ = local_1878;
          auVar7 = vcmpps_avx(auVar30,auVar5,1);
          auVar32._8_8_ = 0x3f8000003f800000;
          auVar32._0_8_ = 0x3f8000003f800000;
          auVar7 = vpand_avx(auVar7,auVar32);
          auVar7 = vsubps_avx(auVar5,auVar7);
          local_e58 = auVar7._0_4_;
          fStack_e54 = auVar7._4_4_;
          fStack_e50 = auVar7._8_4_;
          fStack_e4c = auVar7._12_4_;
          auVar36._4_4_ = fStack_e54 * 0.6933594;
          auVar36._0_4_ = local_e58 * 0.6933594;
          auVar36._8_4_ = fStack_e50 * 0.6933594;
          auVar36._12_4_ = fStack_e4c * 0.6933594;
          auVar7 = vsubps_avx(auVar6,auVar36);
          auVar35._4_4_ = fStack_e54 * -0.00021219444;
          auVar35._0_4_ = local_e58 * -0.00021219444;
          auVar35._8_4_ = fStack_e50 * -0.00021219444;
          auVar35._12_4_ = fStack_e4c * -0.00021219444;
          auVar7 = vsubps_avx(auVar7,auVar35);
          local_1548 = auVar7._0_4_;
          fStack_1544 = auVar7._4_4_;
          fStack_1540 = auVar7._8_4_;
          fStack_153c = auVar7._12_4_;
          local_1888 = CONCAT44((int)fStack_e54,(int)local_e58);
          uStack_1880._0_4_ = (int)fStack_e50;
          uStack_1880._4_4_ = (int)fStack_e4c;
          auVar8._8_8_ = uStack_1880;
          auVar8._0_8_ = local_1888;
          auVar6._8_8_ = 0x7f0000007f;
          auVar6._0_8_ = 0x7f0000007f;
          auVar7 = vpaddd_avx(auVar8,auVar6);
          auVar7 = vpslld_avx(auVar7,ZEXT416(0x17));
          local_1578 = auVar7._0_4_;
          fStack_1574 = auVar7._4_4_;
          fStack_1570 = auVar7._8_4_;
          fStack_156c = auVar7._12_4_;
          local_6b8 = CONCAT44(((((((fStack_1544 * 0.00019875691 + 0.0013981999) * fStack_1544 +
                                   0.008333452) * fStack_1544 + 0.041665796) * fStack_1544 +
                                 0.16666666) * fStack_1544 + 0.5) * fStack_1544 * fStack_1544 +
                                fStack_1544 + 1.0) * fStack_1574 + 1.0,
                               ((((((local_1548 * 0.00019875691 + 0.0013981999) * local_1548 +
                                   0.008333452) * local_1548 + 0.041665796) * local_1548 +
                                 0.16666666) * local_1548 + 0.5) * local_1548 * local_1548 +
                                local_1548 + 1.0) * local_1578 + 1.0);
          uStack_6b0._0_4_ =
               ((((((fStack_1540 * 0.00019875691 + 0.0013981999) * fStack_1540 + 0.008333452) *
                   fStack_1540 + 0.041665796) * fStack_1540 + 0.16666666) * fStack_1540 + 0.5) *
                fStack_1540 * fStack_1540 + fStack_1540 + 1.0) * fStack_1570 + 1.0;
          uStack_6b0._4_4_ =
               ((((((fStack_153c * 0.00019875691 + 0.0013981999) * fStack_153c + 0.008333452) *
                   fStack_153c + 0.041665796) * fStack_153c + 0.16666666) * fStack_153c + 0.5) *
                fStack_153c * fStack_153c + fStack_153c + 1.0) * fStack_156c + 1.0;
          auVar58._8_8_ = uStack_6b0;
          auVar58._0_8_ = local_6b8;
          auVar7 = vcmpps_avx(auVar58,ZEXT816(0),2);
          auVar52._8_8_ = uStack_6b0;
          auVar52._0_8_ = local_6b8;
          auVar51._8_8_ = 0x80000000800000;
          auVar51._0_8_ = 0x80000000800000;
          auVar5 = vmaxps_avx(auVar52,auVar51);
          auVar6 = vpsrld_avx(auVar5,ZEXT416(0x17));
          auVar56._8_8_ = 0x807fffff807fffff;
          auVar56._0_8_ = 0x807fffff807fffff;
          auVar5 = vpand_avx(auVar5,auVar56);
          auVar60._8_8_ = 0x3f0000003f000000;
          auVar60._0_8_ = 0x3f0000003f000000;
          auVar8 = vpor_avx(auVar5,auVar60);
          auVar50._8_8_ = 0x7f0000007f;
          auVar50._0_8_ = 0x7f0000007f;
          auVar5 = vpsubd_avx(auVar6,auVar50);
          auVar5 = vcvtdq2ps_avx(auVar5);
          local_648 = auVar5._0_4_;
          fStack_644 = auVar5._4_4_;
          fStack_640 = auVar5._8_4_;
          fStack_63c = auVar5._12_4_;
          local_6f8 = CONCAT44(fStack_644 + 1.0,local_648 + 1.0);
          uStack_6f0._0_4_ = fStack_640 + 1.0;
          uStack_6f0._4_4_ = fStack_63c + 1.0;
          auVar61._8_8_ = 0x3f3504f33f3504f3;
          auVar61._0_8_ = 0x3f3504f33f3504f3;
          auVar5 = vcmpps_avx(auVar8,auVar61,1);
          auVar6 = vpand_avx(auVar8,auVar5);
          auVar54._8_8_ = 0x3f8000003f800000;
          auVar54._0_8_ = 0x3f8000003f800000;
          auVar8 = vsubps_avx(auVar8,auVar54);
          auVar55._8_8_ = 0x3f8000003f800000;
          auVar55._0_8_ = 0x3f8000003f800000;
          auVar5 = vpand_avx(auVar5,auVar55);
          auVar53._8_8_ = uStack_6f0;
          auVar53._0_8_ = local_6f8;
          auVar5 = vsubps_avx(auVar53,auVar5);
          local_668 = auVar8._0_4_;
          fStack_664 = auVar8._4_4_;
          fStack_660 = auVar8._8_4_;
          fStack_65c = auVar8._12_4_;
          local_678 = auVar6._0_4_;
          fStack_674 = auVar6._4_4_;
          fStack_670 = auVar6._8_4_;
          fStack_66c = auVar6._12_4_;
          local_668 = local_668 + local_678;
          fStack_664 = fStack_664 + fStack_674;
          fStack_660 = fStack_660 + fStack_670;
          fStack_65c = fStack_65c + fStack_66c;
          local_268 = auVar5._0_4_;
          fStack_264 = auVar5._4_4_;
          fStack_260 = auVar5._8_4_;
          fStack_25c = auVar5._12_4_;
          local_738._4_4_ =
               fStack_264 * -0.00021219444 +
               ((((((((fStack_664 * 0.070376836 + -0.1151461) * fStack_664 + 0.116769984) *
                     fStack_664 + -0.12420141) * fStack_664 + 0.14249323) * fStack_664 + -0.16668057
                  ) * fStack_664 + 0.20000714) * fStack_664 + -0.24999994) * fStack_664 + 0.3333333)
               * fStack_664 * fStack_664 * fStack_664;
          local_738._0_4_ =
               local_268 * -0.00021219444 +
               ((((((((local_668 * 0.070376836 + -0.1151461) * local_668 + 0.116769984) * local_668
                    + -0.12420141) * local_668 + 0.14249323) * local_668 + -0.16668057) * local_668
                 + 0.20000714) * local_668 + -0.24999994) * local_668 + 0.3333333) * local_668 *
               local_668 * local_668;
          fStack_730 = fStack_260 * -0.00021219444 +
                       ((((((((fStack_660 * 0.070376836 + -0.1151461) * fStack_660 + 0.116769984) *
                             fStack_660 + -0.12420141) * fStack_660 + 0.14249323) * fStack_660 +
                          -0.16668057) * fStack_660 + 0.20000714) * fStack_660 + -0.24999994) *
                        fStack_660 + 0.3333333) * fStack_660 * fStack_660 * fStack_660;
          fStack_72c = fStack_25c * -0.00021219444 +
                       ((((((((fStack_65c * 0.070376836 + -0.1151461) * fStack_65c + 0.116769984) *
                             fStack_65c + -0.12420141) * fStack_65c + 0.14249323) * fStack_65c +
                          -0.16668057) * fStack_65c + 0.20000714) * fStack_65c + -0.24999994) *
                        fStack_65c + 0.3333333) * fStack_65c * fStack_65c * fStack_65c;
          auVar57._4_4_ = fStack_664 * fStack_664 * 0.5;
          auVar57._0_4_ = local_668 * local_668 * 0.5;
          auVar57._8_4_ = fStack_660 * fStack_660 * 0.5;
          auVar57._12_4_ = fStack_65c * fStack_65c * 0.5;
          auVar5 = vsubps_avx(_local_738,auVar57);
          local_698 = auVar5._0_4_;
          fStack_694 = auVar5._4_4_;
          fStack_690 = auVar5._8_4_;
          fStack_68c = auVar5._12_4_;
          local_6b8 = CONCAT44(fStack_264 * 0.6933594 + fStack_664 + fStack_694,
                               local_268 * 0.6933594 + local_668 + local_698);
          uStack_6b0._0_4_ = fStack_260 * 0.6933594 + fStack_660 + fStack_690;
          uStack_6b0._4_4_ = fStack_25c * 0.6933594 + fStack_65c + fStack_68c;
          auVar59._8_8_ = uStack_6b0;
          auVar59._0_8_ = local_6b8;
          auVar7 = vpor_avx(auVar59,auVar7);
          local_da8 = auVar7._0_4_;
          fStack_da4 = auVar7._4_4_;
          fStack_da0 = auVar7._8_4_;
          fStack_d9c = auVar7._12_4_;
          auVar43._4_4_ = fStack_da4 * 2.0;
          auVar43._0_4_ = local_da8 * 2.0;
          auVar43._12_4_ = fStack_d9c * 2.0;
          auVar43._8_4_ = fStack_da0 * 2.0;
          auVar7 = vsubps_avx(ZEXT816(0),auVar43);
          auVar42._8_8_ = 0x42b0c0a542b0c0a5;
          auVar42._0_8_ = 0x42b0c0a542b0c0a5;
          auVar7 = vminps_avx(auVar7,auVar42);
          auVar41._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar41._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar6 = vmaxps_avx(auVar41,auVar7);
          local_928 = auVar6._0_4_;
          fStack_924 = auVar6._4_4_;
          fStack_920 = auVar6._8_4_;
          fStack_91c = auVar6._12_4_;
          fVar71 = local_928 * 1.442695 + 0.5;
          fVar72 = fStack_924 * 1.442695 + 0.5;
          fVar73 = fStack_920 * 1.442695 + 0.5;
          fVar74 = fStack_91c * 1.442695 + 0.5;
          local_c78 = CONCAT44(fVar72,fVar71);
          uStack_c70._0_4_ = fVar73;
          uStack_c70._4_4_ = fVar74;
          local_c88 = CONCAT44((int)fVar72,(int)fVar71);
          uStack_c80._0_4_ = (int)fVar73;
          uStack_c80._4_4_ = (int)fVar74;
          auVar45._8_8_ = uStack_c80;
          auVar45._0_8_ = local_c88;
          auVar5 = vcvtdq2ps_avx(auVar45);
          auVar46._8_8_ = uStack_c70;
          auVar46._0_8_ = local_c78;
          auVar7 = vcmpps_avx(auVar46,auVar5,1);
          auVar47._8_8_ = 0x3f8000003f800000;
          auVar47._0_8_ = 0x3f8000003f800000;
          auVar7 = vpand_avx(auVar7,auVar47);
          auVar7 = vsubps_avx(auVar5,auVar7);
          local_778 = auVar7._0_4_;
          fStack_774 = auVar7._4_4_;
          fStack_770 = auVar7._8_4_;
          fStack_76c = auVar7._12_4_;
          auVar49._4_4_ = fStack_774 * 0.6933594;
          auVar49._0_4_ = local_778 * 0.6933594;
          auVar49._8_4_ = fStack_770 * 0.6933594;
          auVar49._12_4_ = fStack_76c * 0.6933594;
          auVar7 = vsubps_avx(auVar6,auVar49);
          auVar48._4_4_ = fStack_774 * -0.00021219444;
          auVar48._0_4_ = local_778 * -0.00021219444;
          auVar48._8_4_ = fStack_770 * -0.00021219444;
          auVar48._12_4_ = fStack_76c * -0.00021219444;
          auVar7 = vsubps_avx(auVar7,auVar48);
          local_948 = auVar7._0_4_;
          fStack_944 = auVar7._4_4_;
          fStack_940 = auVar7._8_4_;
          fStack_93c = auVar7._12_4_;
          local_c88 = CONCAT44((int)fStack_774,(int)local_778);
          uStack_c80._0_4_ = (int)fStack_770;
          uStack_c80._4_4_ = (int)fStack_76c;
          auVar40._8_8_ = uStack_c80;
          auVar40._0_8_ = local_c88;
          auVar39._8_8_ = 0x7f0000007f;
          auVar39._0_8_ = 0x7f0000007f;
          auVar7 = vpaddd_avx(auVar40,auVar39);
          auVar7 = vpslld_avx(auVar7,ZEXT416(0x17));
          local_978 = auVar7._0_4_;
          fStack_974 = auVar7._4_4_;
          fStack_970 = auVar7._8_4_;
          fStack_96c = auVar7._12_4_;
          auVar38._8_8_ = 0x3f8000003f800000;
          auVar38._0_8_ = 0x3f8000003f800000;
          auVar37._4_4_ =
               ((((((fStack_944 * 0.00019875691 + 0.0013981999) * fStack_944 + 0.008333452) *
                   fStack_944 + 0.041665796) * fStack_944 + 0.16666666) * fStack_944 + 0.5) *
                fStack_944 * fStack_944 + fStack_944 + 1.0) * fStack_974 + 1.0;
          auVar37._0_4_ =
               ((((((local_948 * 0.00019875691 + 0.0013981999) * local_948 + 0.008333452) *
                   local_948 + 0.041665796) * local_948 + 0.16666666) * local_948 + 0.5) *
                local_948 * local_948 + local_948 + 1.0) * local_978 + 1.0;
          auVar37._8_4_ =
               ((((((fStack_940 * 0.00019875691 + 0.0013981999) * fStack_940 + 0.008333452) *
                   fStack_940 + 0.041665796) * fStack_940 + 0.16666666) * fStack_940 + 0.5) *
                fStack_940 * fStack_940 + fStack_940 + 1.0) * fStack_970 + 1.0;
          auVar37._12_4_ =
               ((((((fStack_93c * 0.00019875691 + 0.0013981999) * fStack_93c + 0.008333452) *
                   fStack_93c + 0.041665796) * fStack_93c + 0.16666666) * fStack_93c + 0.5) *
                fStack_93c * fStack_93c + fStack_93c + 1.0) * fStack_96c + 1.0;
          auVar7 = vdivps_avx(auVar38,auVar37);
          local_dc8 = auVar7._0_4_;
          fStack_dc4 = auVar7._4_4_;
          fStack_dc0 = auVar7._8_4_;
          fStack_dbc = auVar7._12_4_;
          auVar75._0_4_ = local_dc8 * 2.0;
          auVar75._4_4_ = fStack_dc4 * 2.0;
          auVar75._8_4_ = fStack_dc0 * 2.0;
          auVar75._12_4_ = fStack_dbc * 2.0;
          auVar44._8_8_ = 0x3f8000003f800000;
          auVar44._0_8_ = 0x3f8000003f800000;
          auVar7 = vsubps_avx(auVar75,auVar44);
          local_1a38 = auVar7._0_4_;
          fStack_1a34 = auVar7._4_4_;
          fStack_1a30 = auVar7._8_4_;
          fStack_1a2c = auVar7._12_4_;
          local_1d68._4_4_ = fStack_1984 * fStack_1a34;
          local_1d68._0_4_ = local_1988 * local_1a38;
          uStack_1d60._0_4_ = fStack_1a20 * fStack_1a30;
          uStack_1d60._4_4_ = fStack_1a1c * fStack_1a2c;
          break;
        case 6:
          fVar71 = *(float *)*in_stack_00000030;
          fVar72 = *(float *)(*in_stack_00000030 + 4);
          local_19e8 = CONCAT44(fStack_1984 * fVar71 + fVar72,local_1988 * fVar71 + fVar72);
          uStack_19e0._0_4_ = fStack_1a20 * fVar71 + fVar72;
          uStack_19e0._4_4_ = fStack_1a1c * fVar71 + fVar72;
          auVar7._8_8_ = uStack_19e0;
          auVar7._0_8_ = local_19e8;
          auVar7 = vmaxps_avx(auVar7,ZEXT816(0));
          auVar5._8_8_ = 0x3f8000003f800000;
          auVar5._0_8_ = 0x3f8000003f800000;
          auVar7 = vminps_avx(auVar7,auVar5);
          local_1978 = auVar7._0_4_;
          fStack_1974 = auVar7._4_4_;
          fStack_1970 = auVar7._8_4_;
          fStack_196c = auVar7._12_4_;
          local_1d68._4_4_ = fStack_1974 * fStack_1984;
          local_1d68._0_4_ = local_1978 * local_1988;
          uStack_1d60._0_4_ = fStack_1970 * fStack_1a20;
          uStack_1d60._4_4_ = fStack_196c * fStack_1a1c;
          break;
        default:
          uStack_1d60 = uStack_2180;
          local_1d68 = (undefined1  [8])local_2188;
        }
        *local_2100 = local_1d68;
        local_2100[1] = uStack_1d60;
        local_2100 = local_2100 + 2;
      }
    }
  }
  return;
}

Assistant:

static void deconvolution_pack1to4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    int outch = top_blob.c;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const float* bias_data_ptr = bias_data;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        const int maxk = kernel_w * kernel_h;

        // shadowed variable for less openmp task args
        const int w = bottom_blob.w;
        const int h = bottom_blob.h;
        const int channels = bottom_blob.c;
        const int outw = top_blob.w;
        const int outh = top_blob.h;

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                __m128 _sum = _mm_setzero_ps();

                if (bias_data_ptr)
                {
                    _sum = _mm_loadu_ps(bias_data_ptr + p * 4);
                }

                const float* kptr = weight_data_packed.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);

                    for (int y = 0; y < kernel_h; y++)
                    {
                        int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                        if (sys < 0 || sys % stride_h != 0)
                            continue;

                        int sy = sys / stride_h;
                        if (sy >= h)
                            continue;

                        const float* sptr = m.row(sy);

                        for (int x = 0; x < kernel_w; x++)
                        {
                            int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                            if (sxs < 0 || sxs % stride_w != 0)
                                continue;

                            int sx = sxs / stride_w;
                            if (sx >= w)
                                continue;

                            float val = sptr[sx];

                            int k = y * kernel_w + x;

                            __m128 _val = _mm_set1_ps(val);
                            __m128 _w = _mm_load_ps(kptr + k * 4);
                            _sum = _mm_comp_fmadd_ps(_val, _w, _sum);
                        }
                    }

                    kptr += maxk * 4;
                }

                _sum = activation_sse(_sum, activation_type, activation_params);

                _mm_storeu_ps(outptr, _sum);
                outptr += 4;
            }
        }
    }
}